

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int btoupper(bstring b)

{
  uint uVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  __int32_t **pp_Var5;
  uchar uVar6;
  ulong uVar7;
  
  iVar3 = -1;
  iVar4 = -1;
  if (((b != (bstring)0x0) && (iVar4 = iVar3, b->data != (uchar *)0x0)) && (0 < b->mlen)) {
    uVar1 = b->slen;
    if (((int)uVar1 <= b->mlen) && (-1 < (int)uVar1)) {
      if ((ulong)uVar1 != 0) {
        uVar7 = 0;
        do {
          puVar2 = b->data;
          uVar6 = puVar2[uVar7];
          if (-1 < (long)(char)uVar6) {
            pp_Var5 = __ctype_toupper_loc();
            uVar6 = (uchar)(*pp_Var5)[(char)uVar6];
          }
          puVar2[uVar7] = uVar6;
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int btoupper (bstring b) {
int i, len;
	if (b == NULL || b->data == NULL || b->mlen < b->slen ||
	    b->slen < 0 || b->mlen <= 0) return BSTR_ERR;
	for (i=0, len = b->slen; i < len; i++) {
		b->data[i] = (unsigned char) upcase (b->data[i]);
	}
	return BSTR_OK;
}